

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFloat_abi_cxx11_
          (FieldValuePrinter *this,float val)

{
  string *psVar1;
  StringBaseTextGenerator *in_RDI;
  StringBaseTextGenerator generator;
  StringBaseTextGenerator *this_00;
  StringBaseTextGenerator local_40 [16];
  BaseTextGenerator *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffdc;
  FastFieldValuePrinter *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_RDI);
  FastFieldValuePrinter::PrintFloat
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_(local_40);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFloat(float val) const {
  FORWARD_IMPL(PrintFloat, val);
}